

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O0

cfg_entry *
cfg_db_set_entry_ext
          (cfg_db *db,char *section_type,char *section_name,char *entry_name,char *value,
          _Bool append,_Bool front)

{
  bool bVar1;
  int iVar2;
  cfg_named_section *local_98;
  _Bool local_71;
  _Bool new_entry;
  cfg_named_section *pcStack_70;
  _Bool new_section;
  cfg_named_section *named;
  cfg_entry *entry;
  _Bool front_local;
  char *pcStack_58;
  _Bool append_local;
  char *value_local;
  char *entry_name_local;
  char *section_name_local;
  char *section_type_local;
  cfg_db *db_local;
  undefined8 local_28;
  cfg_named_section *local_20;
  cfg_section_type **local_18;
  cfg_section_type **local_10;
  
  entry._6_1_ = front;
  local_71 = false;
  bVar1 = false;
  entry._7_1_ = append;
  pcStack_58 = value;
  value_local = entry_name;
  entry_name_local = section_name;
  section_name_local = section_type;
  section_type_local = (char *)db;
  pcStack_70 = _cfg_db_add_section(db,section_type,section_name,&local_71);
  if (pcStack_70 == (cfg_named_section *)0x0) {
    return (cfg_entry *)0x0;
  }
  local_20 = (cfg_named_section *)avl_find(&pcStack_70->entries,value_local);
  local_28 = 0;
  local_98 = local_20;
  if (local_20 == (cfg_named_section *)0x0) {
    local_98 = (cfg_named_section *)0x0;
  }
  named = local_98;
  if (local_98 == (cfg_named_section *)0x0) {
    named = (cfg_named_section *)_alloc_entry(pcStack_70,value_local);
    if (named == (cfg_named_section *)0x0) goto LAB_00146b4b;
    bVar1 = true;
  }
  if ((entry._7_1_ & 1) == 0) {
    local_18 = &named->section_type;
    free(*local_18);
    local_10 = local_18;
    memset(local_18,0,0x10);
  }
  if ((entry._6_1_ & 1) == 0) {
    iVar2 = strarray_append((strarray *)&named->section_type,pcStack_58);
  }
  else {
    iVar2 = strarray_prepend((strarray *)&named->section_type,pcStack_58);
  }
  if (iVar2 == 0) {
    return (cfg_entry *)named;
  }
LAB_00146b4b:
  if (bVar1) {
    _free_entry((cfg_entry *)named);
  }
  if ((local_71 & 1U) != 0) {
    _free_namedsection(pcStack_70);
  }
  return (cfg_entry *)0x0;
}

Assistant:

struct cfg_entry *
cfg_db_set_entry_ext(struct cfg_db *db, const char *section_type, const char *section_name, const char *entry_name,
  const char *value, bool append, bool front) {
  struct cfg_entry *entry;
  struct cfg_named_section *named;
  bool new_section = false, new_entry = NULL;

  /* create section */
  named = _cfg_db_add_section(db, section_type, section_name, &new_section);
  if (!named) {
    return NULL;
  }

  /* get entry */
  entry = avl_find_element(&named->entries, entry_name, entry, node);
  if (!entry) {
    entry = _alloc_entry(named, entry_name);
    if (!entry) {
      goto set_entry_error;
    }
    new_entry = true;
  }

  if (!append) {
    strarray_free(&entry->val);
  }
  /* prepend new entry */
  if (front) {
    if (strarray_prepend(&entry->val, value)) {
      goto set_entry_error;
    }
  }
  else {
    if (strarray_append(&entry->val, value)) {
      goto set_entry_error;
    }
  }

  return entry;
set_entry_error:
  if (new_entry) {
    _free_entry(entry);
  }
  if (new_section) {
    _free_namedsection(named);
  }
  return NULL;
}